

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O3

obj * worst_cursed_item(void)

{
  boolean bVar1;
  int iVar2;
  obj *poVar3;
  obj *obj;
  
  iVar2 = near_capacity();
  poVar3 = invent;
  if (invent != (obj *)0x0 && 2 < iVar2) {
    do {
      if ((poVar3->otyp == 0x210) && ((poVar3->field_0x4a & 1) != 0)) {
        return poVar3;
      }
      poVar3 = poVar3->nobj;
    } while (poVar3 != (obj *)0x0);
  }
  iVar2 = welded(uwep);
  if ((((((iVar2 == 0) ||
         ((poVar3 = uwep, uright == (obj *)0x0 &&
          (((byte)(uwep->oclass | 4U) != 6 || ((objects[uwep->otyp].field_0x11 & 1) == 0)))))) &&
        ((uarmg == (obj *)0x0 || (poVar3 = uarmg, (uarmg->field_0x4a & 1) == 0)))) &&
       ((((uarms == (obj *)0x0 || (poVar3 = uarms, (uarms->field_0x4a & 1) == 0)) &&
         ((uarmc == (obj *)0x0 || (poVar3 = uarmc, (uarmc->field_0x4a & 1) == 0)))) &&
        ((uarm == (obj *)0x0 || (poVar3 = uarm, (uarm->field_0x4a & 1) == 0)))))) &&
      ((((uarmh == (obj *)0x0 || (poVar3 = uarmh, (uarmh->field_0x4a & 1) == 0)) &&
        ((((uarmf == (obj *)0x0 || (poVar3 = uarmf, (uarmf->field_0x4a & 1) == 0)) &&
          ((uarmu == (obj *)0x0 || (poVar3 = uarmu, (uarmu->field_0x4a & 1) == 0)))) &&
         ((uamul == (obj *)0x0 || (poVar3 = uamul, (uamul->field_0x4a & 1) == 0)))))) &&
       ((uleft == (obj *)0x0 || (poVar3 = uleft, (uleft->field_0x4a & 1) == 0)))))) &&
     ((((uright == (obj *)0x0 || (poVar3 = uright, (uright->field_0x4a & 1) == 0)) &&
       ((ublindf == (obj *)0x0 || (poVar3 = ublindf, (ublindf->field_0x4a & 1) == 0)))) &&
      ((iVar2 = welded(uwep), poVar3 = uwep, iVar2 == 0 &&
       (((uswapwep == (obj *)0x0 || ((uswapwep->field_0x4a & 1) == 0)) ||
        (poVar3 = uswapwep, u.twoweap == '\0')))))))) {
    obj = invent;
    while ((poVar3 = (obj *)0x0, obj != (obj *)0x0 &&
           (((obj->field_0x4a & 1) == 0 ||
            ((poVar3 = obj, obj->otyp != 0x210 && (bVar1 = confers_luck(obj), bVar1 == '\0'))))))) {
      obj = obj->nobj;
    }
  }
  return poVar3;
}

Assistant:

static struct obj *worst_cursed_item(void)
{
    struct obj *otmp;

    /* if strained or worse, check for loadstone first */
    if (near_capacity() >= HVY_ENCUMBER) {
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (Cursed_obj(otmp, LOADSTONE)) return otmp;
    }
    /* weapon takes precedence if it is interfering
       with taking off a ring or putting on a shield */
    if (welded(uwep) && (uright || bimanual(uwep))) {	/* weapon */
	otmp = uwep;
    /* gloves come next, due to rings */
    } else if (uarmg && uarmg->cursed) {		/* gloves */
	otmp = uarmg;
    /* then shield due to two handed weapons and spells */
    } else if (uarms && uarms->cursed) {		/* shield */
	otmp = uarms;
    /* then cloak due to body armor */
    } else if (uarmc && uarmc->cursed) {		/* cloak */
	otmp = uarmc;
    } else if (uarm && uarm->cursed) {			/* suit */
	otmp = uarm;
    } else if (uarmh && uarmh->cursed) {		/* helmet */
	otmp = uarmh;
    } else if (uarmf && uarmf->cursed) {		/* boots */
	otmp = uarmf;
    } else if (uarmu && uarmu->cursed) {		/* shirt */
	otmp = uarmu;
    } else if (uamul && uamul->cursed) {		/* amulet */
	otmp = uamul;
    } else if (uleft && uleft->cursed) {		/* left ring */
	otmp = uleft;
    } else if (uright && uright->cursed) {		/* right ring */
	otmp = uright;
    } else if (ublindf && ublindf->cursed) {		/* eyewear */
	otmp = ublindf;	/* must be non-blinding lenses */
    /* if weapon wasn't handled above, do it now */
    } else if (welded(uwep)) {				/* weapon */
	otmp = uwep;
    /* active secondary weapon even though it isn't welded */
    } else if (uswapwep && uswapwep->cursed && u.twoweap) {
	otmp = uswapwep;
    /* all worn items ought to be handled by now */
    } else {
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (!otmp->cursed) continue;
	    if (otmp->otyp == LOADSTONE || confers_luck(otmp))
		break;
	}
    }
    return otmp;
}